

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::UpdateArrayBailOutKind(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  RegOpnd *this_00;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  IndirOpnd *pIVar7;
  ArrayRegOpnd *pAVar8;
  Instr *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType baseValueType;
  
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1451,"(!IsPrePass())","!IsPrePass()");
    if (!bVar3) goto LAB_003c9b10;
    *puVar6 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1452,"(instr)","instr");
    if (!bVar3) goto LAB_003c9b10;
    *puVar6 = 0;
  }
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1453,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar3) goto LAB_003c9b10;
    *puVar6 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A_Strict)) && (OVar1 != StElemI_A)) {
    return;
  }
  bVar3 = IR::Opnd::IsIndirOpnd(instr->m_dst);
  if (!bVar3) {
    return;
  }
  pIVar7 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  this_00 = pIVar7->m_baseOpnd;
  local_2a[0] = (this_00->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_2a[0].field_0);
  if (bVar3) {
    return;
  }
  pIVar7 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  pIVar7->m_conversionAllowed = true;
  bVar3 = ValueType::IsNotNativeArray((ValueType *)&local_2a[0].field_0);
  BVar5 = BailOutInvalid;
  if (((!bVar3) &&
      (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                         (this->currentBlock->noImplicitCallNativeArrayUses), BVar5 = BailOutInvalid
      , !bVar3)) && (BVar4 = IR::Instr::GetBailOutKind(instr), (BVar4 >> 0x11 & 1) == 0)) {
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_2a[0].field_0);
    BVar5 = BailOutConvertedNativeArray;
    if ((bVar3) && (instr->m_src1->m_type != TyVar)) {
      pIVar7 = IR::Opnd::AsIndirOpnd(instr->m_dst);
      pIVar7->m_conversionAllowed = false;
      BVar5 = BailOutInvalid;
    }
  }
  bVar3 = IR::RegOpnd::IsArrayRegOpnd(this_00);
  if ((bVar3) &&
     (pAVar8 = IR::RegOpnd::AsArrayRegOpnd(this_00), pAVar8->eliminatedUpperBoundCheck == true)) {
    if (((instr->field_0x37 & 0x10) != 0) &&
       (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses), !bVar3)) {
      this_01 = GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
      if (this_01 == (Instr *)0x0 || this_01 == instr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1481,"(upperBoundCheck && upperBoundCheck != instr)",
                           "upperBoundCheck && upperBoundCheck != instr");
        if (!bVar3) goto LAB_003c9b10;
        *puVar6 = 0;
      }
      BVar4 = IR::Instr::GetBailOutKind(this_01);
      if (BVar4 == BailOutOnArrayAccessHelperCall) {
        IR::Instr::SetBailOutKind(this_01,BailOutOnInvalidatedArrayHeadSegment);
      }
      else {
        BVar4 = IR::Instr::GetBailOutKind(this_01);
        if (BVar4 != BailOutOnFailedHoistedBoundCheck) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1489,
                             "(upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck)"
                             ,
                             "upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck"
                            );
          if (!bVar3) {
LAB_003c9b10:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
      }
    }
  }
  else {
    bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses);
    if (bVar3) {
      bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                        (this->currentBlock->noImplicitCallNoMissingValuesUses);
      if (!bVar3) {
        BVar4 = IR::Instr::GetBailOutKind(instr);
        BVar5 = (BVar4 >> 3 & BailOutOnMissingValue | BVar5) ^ BailOutOnMissingValue;
      }
    }
    else {
      BVar5 = BVar5 | BailOutOnInvalidatedArrayHeadSegment;
    }
    bVar3 = ValueType::IsNotArray((ValueType *)&local_2a[0].field_0);
    if ((!bVar3) &&
       (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          (this->currentBlock->noImplicitCallArrayLengthSymUses), !bVar3)) {
      BVar5 = BVar5 | BailOutOnInvalidatedArrayLength;
      goto LAB_003c9a32;
    }
  }
  if (BVar5 == BailOutInvalid) {
    return;
  }
LAB_003c9a32:
  BVar4 = IR::Instr::GetBailOutKind(instr);
  IR::Instr::SetBailOutKind(instr,BVar5 | BVar4);
  return;
}

Assistant:

void
BackwardPass::UpdateArrayBailOutKind(IR::Instr *const instr)
{
    Assert(!IsPrePass());
    Assert(instr);
    Assert(instr->HasBailOutInfo());

    if ((instr->m_opcode != Js::OpCode::StElemI_A && instr->m_opcode != Js::OpCode::StElemI_A_Strict &&
        instr->m_opcode != Js::OpCode::Memcopy && instr->m_opcode != Js::OpCode::Memset) ||
        !instr->GetDst()->IsIndirOpnd())
    {
        return;
    }

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    if(baseValueType.IsNotArrayOrObjectWithArray())
    {
        return;
    }

    instr->GetDst()->AsIndirOpnd()->AllowConversion(true);
    IR::BailOutKind includeBailOutKinds = IR::BailOutInvalid;
    if (!baseValueType.IsNotNativeArray() &&
        !currentBlock->noImplicitCallNativeArrayUses->IsEmpty() &&
        !(instr->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall))
    {
        // There is an upwards-exposed use of a native array. Since the array referenced by this instruction can be aliased,
        // this instruction needs to bail out if it converts the native array even if this array specifically is not
        // upwards-exposed.
        if (!baseValueType.IsLikelyNativeArray() || instr->GetSrc1()->IsVar())
        {
            includeBailOutKinds |= IR::BailOutConvertedNativeArray;
        }
        else
        {
            // We are assuming that array conversion is impossible here, so make sure we execute code that fails if conversion does happen.
            instr->GetDst()->AsIndirOpnd()->AllowConversion(false);
        }
    }

    if(baseOpnd->IsArrayRegOpnd() && baseOpnd->AsArrayRegOpnd()->EliminatedUpperBoundCheck())
    {
        if(instr->extractedUpperBoundCheckWithoutHoisting && !currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())
        {
            // See comment below regarding head segment invalidation. A failed upper bound check usually means that it will
            // invalidate the head segment length, so change the bailout kind on the upper bound check to have it bail out for
            // the right reason. Even though the store may actually occur in a non-head segment, which would not invalidate the
            // head segment or length, any store outside the head segment bounds causes head segment load elimination to be
            // turned off for the store, because the segment structure of the array is not guaranteed to be the same every time.
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);

            if(upperBoundCheck->GetBailOutKind() == IR::BailOutOnArrayAccessHelperCall)
            {
                upperBoundCheck->SetBailOutKind(IR::BailOutOnInvalidatedArrayHeadSegment);
            }
            else
            {
                Assert(upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck);
            }
        }
    }
    else
    {
        if(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())
        {
            // There is an upwards-exposed use of a segment sym. Since the head segment syms referenced by this instruction can
            // be aliased, this instruction needs to bail out if it changes the segment syms it references even if the ones it
            // references specifically are not upwards-exposed. This bailout kind also guarantees that this element store will
            // not create missing values.
            includeBailOutKinds |= IR::BailOutOnInvalidatedArrayHeadSegment;
        }
        else if(
            !currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty() &&
            !(instr->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall))
        {
            // There is an upwards-exposed use of an array with no missing values. Since the array referenced by this
            // instruction can be aliased, this instruction needs to bail out if it creates a missing value in the array even if
            // this array specifically is not upwards-exposed.
            includeBailOutKinds |= IR::BailOutOnMissingValue;
        }

        if(!baseValueType.IsNotArray() && !currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty())
        {
            // There is an upwards-exposed use of a length sym. Since the length sym referenced by this instruction can be
            // aliased, this instruction needs to bail out if it changes the length sym it references even if the ones it
            // references specifically are not upwards-exposed.
            includeBailOutKinds |= IR::BailOutOnInvalidatedArrayLength;
        }
    }

    if(!includeBailOutKinds)
    {
        return;
    }

    Assert(!(includeBailOutKinds & ~IR::BailOutKindBits));
    instr->SetBailOutKind(instr->GetBailOutKind() | includeBailOutKinds);
}